

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  _Elt_pointer piVar1;
  ulong uVar2;
  bool bVar3;
  char c;
  int n;
  stack<int> s;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s1;
  byte local_9d;
  int local_9c;
  stack<int> local_98;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  local_98.mData = (int *)operator_new__(4);
  *local_98.mData = 0;
  local_98.mCap = 1;
  local_98.mSize = 0;
  __isoc99_scanf("%c",&local_9d);
  do {
    switch(local_9d) {
    case 0x6d:
    case 0x72:
switchD_00101368_caseD_6d:
      __isoc99_scanf("%d",&local_9c);
      if (local_9d == 0x72) {
        CP::stack<int>::remove_top
                  ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80,&local_98,
                   (long)local_9c);
        printf("remove_top Result: Size = %d Data =",local_98.mSize & 0xffffffff);
        if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
          do {
            piVar1 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
              piVar1 = local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            printf(" %d",(ulong)(uint)piVar1[-1]);
            if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_80._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
              local_80._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_80._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_80._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
              local_80._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_80._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
              local_80._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_80._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_80._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_80._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   local_80._M_impl.super__Deque_impl_data._M_start._M_cur);
        }
        putchar(10);
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
      }
      else if (local_9d == 0x6d) {
        bVar3 = (ulong)(long)local_9c <= local_98.mSize;
        uVar2 = local_98.mSize - (long)local_9c;
        local_98.mSize = 0;
        if (bVar3) {
          local_98.mSize = uVar2;
        }
      }
      else if (local_9d == 0x61) {
        CP::stack<int>::push(&local_98,&local_9c);
      }
      break;
    case 0x6e:
    case 0x6f:
      break;
    case 0x70:
      CP::stack<int>::print(&local_98);
      break;
    case 0x71:
      if (local_98.mData != (int *)0x0) {
        operator_delete__(local_98.mData);
      }
      return 0;
    default:
      if (local_9d == 100) {
        CP::stack<int>::pop(&local_98);
      }
      else if (local_9d == 0x61) goto switchD_00101368_caseD_6d;
    }
    __isoc99_scanf("%c",&local_9d);
  } while( true );
}

Assistant:

int main() {
  CP::stack<int> s;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a' || c == 'm' || c == 'r') {
      // add data
      int n;
      scanf("%d", &n);
      if (c == 'a') {
        s.push(n);
      } else if (c == 'm') {
        s.multi_pop(n);
      } else if (c == 'r') {
        auto s1 = s.remove_top(n);
        printf("remove_top Result: Size = %d Data =",(int)s.size());
        while (s1.empty() == false) {
          printf(" %d",s1.top()); s1.pop();
        }
        printf("\n");
      }
    } else if (c == 'd') {
       s.pop();
    } else if (c == 'p') {
      s.print();
    }
    scanf("%c", &c);
  }
  return 0;
}